

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O3

bool __thiscall
__gnu_cxx::__ops::
_Val_comp_iter<xray_re::xr_mesh_builder::b_proxy::less2<xray_re::_vector3<float>,xray_re::_influence<unsigned_int,float>>>
::operator()(void *this,b_proxy *__val,
            __normal_iterator<xray_re::xr_mesh_builder::b_proxy_*,_std::vector<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>_>
            __it)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  
  lVar11 = *this;
  uVar8 = (ulong)__val->index;
  uVar9 = (ulong)(__it._M_current)->index;
  fVar3 = *(float *)(lVar11 + uVar8 * 0xc);
  fVar4 = *(float *)(lVar11 + uVar9 * 0xc);
  bVar12 = true;
  if (fVar4 <= fVar3) {
    if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
      return false;
    }
    lVar1 = lVar11 + uVar8 * 0xc;
    lVar11 = lVar11 + uVar9 * 0xc;
    fVar3 = *(float *)(lVar1 + 4);
    fVar4 = *(float *)(lVar11 + 4);
    if (fVar4 <= fVar3) {
      if (fVar3 != fVar4) {
        return false;
      }
      if (NAN(fVar3) || NAN(fVar4)) {
        return false;
      }
      fVar3 = *(float *)(lVar1 + 8);
      fVar4 = *(float *)(lVar11 + 8);
      if (fVar4 <= fVar3) {
        if (fVar3 != fVar4) {
          return false;
        }
        if (NAN(fVar3) || NAN(fVar4)) {
          return false;
        }
        lVar7 = *(long *)((long)this + 8);
        lVar1 = lVar7 + uVar8 * 0x24;
        uVar8 = (ulong)*(uint *)(lVar1 + 0x20);
        uVar5 = *(uint *)(lVar7 + 0x20 + uVar9 * 0x24);
        bVar12 = (ulong)uVar5 != 0;
        lVar11 = lVar1;
        if ((uVar8 != 0) && (uVar5 != 0)) {
          lVar2 = (ulong)uVar5 * 8 + -8;
          lVar7 = lVar7 + uVar9 * 0x24;
          lVar10 = 0;
          do {
            uVar5 = *(uint *)(lVar1 + lVar10);
            uVar6 = *(uint *)(lVar7 + lVar10);
            fVar3 = *(float *)(lVar1 + 4 + lVar10);
            fVar4 = *(float *)(lVar7 + 4 + lVar10);
            if (((uVar5 != uVar6) || (fVar3 != fVar4)) || (NAN(fVar3) || NAN(fVar4))) {
              if (uVar5 < uVar6) {
                return true;
              }
              if (uVar5 != uVar6) {
                return false;
              }
              if (fVar4 <= fVar3) {
                return false;
              }
              return true;
            }
            bVar12 = lVar2 != lVar10;
            lVar11 = lVar10 + 8;
          } while ((uVar8 * 8 + -8 != lVar10) && (bVar13 = lVar2 != lVar10, lVar10 = lVar11, bVar13)
                  );
          lVar11 = lVar11 + lVar1;
        }
        bVar12 = (bool)(lVar11 == lVar1 + uVar8 * 8 & bVar12);
      }
    }
  }
  return bVar12;
}

Assistant:

inline bool operator()(const b_proxy& l, const b_proxy& r) const {
		return data1[l.index] < data1[r.index] ||
				(data1[l.index] == data1[r.index] && data2[l.index] < data2[r.index]);
	}